

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

bool kratos::connected(shared_ptr<kratos::Port> *port,
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *bits)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar5;
  VarException *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  undefined8 *puVar10;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar11;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 local_c8 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sources;
  IRNode *local_78;
  string local_70;
  undefined1 local_50 [8];
  shared_ptr<kratos::VarSlice> ptr;
  allocator<char> local_32;
  allocator_type local_31;
  
  uVar3 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Var).super_IRNode._vptr_IRNode[7])();
  std::__detail::
  _Rehash_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
             *)bits,(ulong)uVar3);
  iVar4 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Var).super_IRNode._vptr_IRNode[0x10])();
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x18) == 0) {
    bVar8 = false;
  }
  else {
    iVar4 = (*(((port->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Var).super_IRNode._vptr_IRNode[0x10])();
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_c8,
                 (_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)CONCAT44(extraout_var_00,iVar4));
    puVar10 = (undefined8 *)sources._M_h._M_bucket_count;
    ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)port;
LAB_001b2c36:
    if (puVar10 == (undefined8 *)0x0) {
      bVar7 = false;
      bVar8 = false;
    }
    else {
      if (*(int *)(*(long *)(puVar10[1] + 0xc0) + 0x168) == 2) goto LAB_001b2c57;
      uVar3 = 0;
      while (local_70._M_dataplus._M_p._0_4_ = uVar3,
            uVar9 = (*(((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)port)->
                        _vptr__Sp_counted_base)->_M_ptr->super_Var).super_IRNode._vptr_IRNode[7])(),
            uVar3 < uVar9) {
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<unsigned_int&>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)bits,&local_70);
        uVar3 = (uint)local_70._M_dataplus._M_p + 1;
      }
      bVar7 = true;
      bVar8 = true;
    }
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_c8);
    if (bVar8 != false) {
      uVar1 = (bits->_M_h)._M_element_count;
      uVar3 = (*(((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)port)->_vptr__Sp_counted_base)->
                 _M_ptr->super_Var).super_IRNode._vptr_IRNode[7])();
      bVar8 = bVar7;
      if (uVar1 != uVar3) {
        bVar8 = false;
      }
    }
  }
  return bVar8;
LAB_001b2c57:
  Var::as<kratos::VarSlice>((Var *)local_50);
  peVar5 = (element_type *)(**(code **)(*(_func_int **)local_50 + 0x148))();
  if (peVar5 == ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)port)->_vptr__Sp_counted_base)->
                _M_ptr) {
    cVar2 = (**(code **)(*(_func_int **)local_50 + 0x158))();
    if (cVar2 == '\0') {
      uVar3 = (**(code **)(*(_func_int **)local_50 + 0x130))();
      uVar9 = (**(code **)(*(_func_int **)local_50 + 0x128))();
      uVar6 = extraout_RDX_00;
      local_70._M_dataplus._M_p._0_4_ = uVar3;
    }
    else {
      iVar4 = (**(code **)(*(ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + 0x38))();
      uVar9 = iVar4 - 1;
      uVar6 = extraout_RDX;
      local_70._M_dataplus._M_p._0_4_ = 0;
    }
    for (; (uint)local_70._M_dataplus._M_p <= uVar9;
        local_70._M_dataplus._M_p._0_4_ = (uint)local_70._M_dataplus._M_p + 1) {
      pVar11 = std::
               _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::_M_emplace<unsigned_int&>
                         ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)bits,&local_70,uVar6);
      uVar6 = pVar11._8_8_;
    }
  }
  else {
    cVar2 = (**(code **)(*(_func_int **)local_50 + 0x158))();
    if (cVar2 == '\0') {
      this = (VarException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Internal error. Variable has un-related sources",&local_32);
      local_78 = (IRNode *)
                 (ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
      __l._M_len = 1;
      __l._M_array = &local_78;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &sources._M_h._M_single_bucket,__l,&local_31);
      VarException::VarException
                (this,&local_70,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &sources._M_h._M_single_bucket);
      __cxa_throw(this,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  port = (shared_ptr<kratos::Port> *)
         ptr.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr);
  puVar10 = (undefined8 *)*puVar10;
  goto LAB_001b2c36;
}

Assistant:

bool connected(const std::shared_ptr<Port>& port, std::unordered_set<uint32_t>& bits) {
    bool result = false;
    bits.reserve(port->width());
    if (!port->sources().empty()) {
        // it has been assigned. need to compute all the slices
        auto sources = port->sources();
        for (const auto& stmt : sources) {
            auto* src = stmt->left();
            if (src->type() == VarType::Slice) {
                auto ptr = src->as<VarSlice>();
                auto* ptr_parent = ptr->get_var_root_parent();
                uint32_t high, low;
                if (ptr_parent != port.get()) {
                    // it got be a sliced by var
                    if (!ptr->sliced_by_var())
                        throw VarException("Internal error. Variable has un-related sources",
                                           {port.get()});
                    // it's actually not driven by the current net
                    continue;
                } else {
                    if (ptr->sliced_by_var()) {
                        // possibly to hit all bits
                        low = 0;
                        high = port->width() - 1;
                    } else {
                        low = ptr->var_low();
                        high = ptr->var_high();
                    }
                }
                for (uint32_t i = low; i <= high; i++) {
                    bits.emplace(i);
                }
            } else {
                result = true;
                for (uint32_t i = 0; i < port->width(); i++) bits.emplace(i);
                break;
            }
        }
    }
    if (result && bits.size() != port->width()) result = false;
    return result;
}